

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void BZ2_blockSort(EState *s)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  Int32 i;
  Int32 budgetInit;
  Int32 budget;
  UInt16 *quadrant;
  Int32 wfact;
  Int32 verb;
  Int32 nblock;
  UInt32 *ftab;
  UChar *block;
  UInt32 *ptr;
  Int32 in_stack_000007e8;
  Int32 in_stack_000007ec;
  UInt32 *in_stack_000007f0;
  UInt32 *in_stack_000007f8;
  UInt32 *in_stack_00000800;
  Int32 in_stack_00000d00;
  Int32 in_stack_00000d04;
  UInt32 *in_stack_00000d08;
  UInt16 *in_stack_00000d10;
  UChar *in_stack_00000d18;
  UInt32 *in_stack_00000d20;
  Int32 *in_stack_00000d30;
  int local_44;
  int local_2c;
  
  lVar2 = *(long *)(in_RDI + 0x38);
  iVar1 = *(int *)(in_RDI + 0x6c);
  local_2c = *(int *)(in_RDI + 0x58);
  if (iVar1 < 10000) {
    fallbackSort(in_stack_00000800,in_stack_000007f8,in_stack_000007f0,in_stack_000007ec,
                 in_stack_000007e8);
  }
  else {
    if (local_2c < 1) {
      local_2c = 1;
    }
    if (100 < local_2c) {
      local_2c = 100;
    }
    mainSort(in_stack_00000d20,in_stack_00000d18,in_stack_00000d10,in_stack_00000d08,
             in_stack_00000d04,in_stack_00000d00,in_stack_00000d30);
    if (iVar1 * ((local_2c + -1) / 3) < 0) {
      fallbackSort(in_stack_00000800,in_stack_000007f8,in_stack_000007f0,in_stack_000007ec,
                   in_stack_000007e8);
    }
  }
  *(undefined4 *)(in_RDI + 0x30) = 0xffffffff;
  local_44 = 0;
  do {
    if (*(int *)(in_RDI + 0x6c) <= local_44) {
LAB_0011477f:
      if (*(int *)(in_RDI + 0x30) == -1) {
        bz_internal_error(0x3eb);
      }
      return;
    }
    if (*(int *)(lVar2 + (long)local_44 * 4) == 0) {
      *(int *)(in_RDI + 0x30) = local_44;
      goto LAB_0011477f;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}